

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::copyTexImage1D
          (ReferenceContext *this,deUint32 target,int level,deUint32 internalFormat,int x,int y,
          int width,int border)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  int b;
  reference pvVar4;
  TextureFormat *other;
  PixelBufferAccess *pPVar5;
  ConstPixelBufferAccess *pCVar6;
  Texture1D *local_118;
  Vec4 local_fc;
  int local_ec;
  undefined1 local_e8 [4];
  int xo;
  PixelBufferAccess dst;
  ConstPixelBufferAccess dst_1;
  Texture1D *texture;
  MultisamplePixelBufferAccess local_88;
  undefined1 local_60 [8];
  MultisampleConstPixelBufferAccess src;
  TextureFormat storageFmt;
  TextureUnit *unit;
  int y_local;
  int x_local;
  deUint32 internalFormat_local;
  int level_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  pvVar4 = std::
           vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ::operator[](&this->m_textureUnits,(long)this->m_activeTexture);
  tcu::TextureFormat::TextureFormat((TextureFormat *)&src.m_access.m_data);
  getReadColorbuffer(&local_88,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)local_60,&local_88);
  do {
    if (border != 0) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    if ((width < 0) || (level < 0)) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    bVar1 = isEmpty((MultisampleConstPixelBufferAccess *)local_60);
    if (bVar1) {
      setError(this,0x502);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  src.m_access.m_data = (void *)mapInternalFormat(internalFormat);
  do {
    if (((int)src.m_access.m_data == 0x15) || (src.m_access.m_data._4_4_ == 0x26)) {
      setError(this,0x500);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if (target == 0xde0) {
    do {
      if ((this->m_limits).maxTexture2DSize < width) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      iVar3 = deLog2Floor32((this->m_limits).maxTexture2DSize);
      if (iVar3 < level) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    if (pvVar4->tex1DBinding == (Texture1D *)0x0) {
      local_118 = &pvVar4->default1DTex;
    }
    else {
      local_118 = pvVar4->tex1DBinding;
    }
    bVar1 = rc::Texture::isImmutable(&local_118->super_Texture);
    if (bVar1) {
      do {
        bVar1 = rc::Texture1D::hasLevel(local_118,level);
        if (!bVar1) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pCVar6 = &rc::Texture1D::getLevel(local_118,level)->super_ConstPixelBufferAccess;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&dst.super_ConstPixelBufferAccess.m_data,pCVar6);
      do {
        other = tcu::ConstPixelBufferAccess::getFormat
                          ((ConstPixelBufferAccess *)&dst.super_ConstPixelBufferAccess.m_data);
        bVar1 = tcu::TextureFormat::operator!=((TextureFormat *)&src.m_access.m_data,other);
        if ((bVar1) ||
           (iVar3 = tcu::ConstPixelBufferAccess::getWidth
                              ((ConstPixelBufferAccess *)&dst.super_ConstPixelBufferAccess.m_data),
           width != iVar3)) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
    }
    else {
      rc::Texture1D::allocLevel(local_118,level,(TextureFormat *)&src.m_access.m_data,width);
    }
    pPVar5 = rc::Texture1D::getLevel(local_118,level);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_e8,pPVar5);
    for (local_ec = 0; local_ec < width; local_ec = local_ec + 1) {
      iVar3 = x + local_ec;
      pCVar6 = rr::MultisampleConstPixelBufferAccess::raw
                         ((MultisampleConstPixelBufferAccess *)local_60);
      b = tcu::ConstPixelBufferAccess::getHeight(pCVar6);
      bVar1 = de::inBounds<int>(iVar3,0,b);
      if (bVar1) {
        rr::resolveMultisamplePixel
                  ((rr *)&local_fc,(MultisampleConstPixelBufferAccess *)local_60,x + local_ec,y);
        tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)local_e8,&local_fc,local_ec,0,0);
      }
    }
  }
  else {
    setError(this,0x500);
  }
  return;
}

Assistant:

void ReferenceContext::copyTexImage1D (deUint32 target, int level, deUint32 internalFormat, int x, int y, int width, int border)
{
	TextureUnit&							unit		= m_textureUnits[m_activeTexture];
	TextureFormat							storageFmt;
	rr::MultisampleConstPixelBufferAccess	src			= getReadColorbuffer();

	RC_IF_ERROR(border != 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || level < 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(isEmpty(src), GL_INVALID_OPERATION, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_1D)
	{
		// Validate size and level.
		RC_IF_ERROR(width > m_limits.maxTexture2DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture1D* texture = unit.tex1DBinding ? unit.tex1DBinding : &unit.default1DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width);

		// Copy from current framebuffer.
		PixelBufferAccess dst = texture->getLevel(level);
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()))
				continue; // Undefined pixel.

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y), xo, 0);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}